

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirit2_playground.cpp
# Opt level: O3

void __thiscall client::mini_xml_printer::operator()(mini_xml_printer *this,mini_xml *xml)

{
  pointer pvVar1;
  ostream *poVar2;
  int iVar3;
  pointer this_00;
  char local_31 [5];
  mini_xml_node_printer local_2c;
  
  iVar3 = this->indent;
  if (0 < iVar3) {
    do {
      local_31[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_31,1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"tag: ",5);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(xml->name)._M_dataplus._M_p,
                      (xml->name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  iVar3 = this->indent;
  if (0 < iVar3) {
    do {
      local_31[1] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_31 + 1,1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  local_31[3] = 0x7b;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_31 + 3,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  this_00 = (xml->children).
            super__Vector_base<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (xml->children).
           super__Vector_base<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pvVar1) {
    do {
      local_2c.indent = this->indent;
      boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>::
      apply_visitor<client::mini_xml_node_printer_const>
                ((variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string> *)this_00
                 ,&local_2c);
      this_00 = this_00 + 1;
    } while (this_00 != pvVar1);
  }
  iVar3 = this->indent;
  if (0 < iVar3) {
    do {
      local_31[2] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_31 + 2,1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  local_31[4] = 0x7d;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_31 + 4,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void mini_xml_printer::operator()(mini_xml const& xml) const
    {
        tab(indent);
        std::cout << "tag: " << xml.name << std::endl;
        tab(indent);
        std::cout << '{' << std::endl;

        BOOST_FOREACH(mini_xml_node const& node, xml.children)
        {
            boost::apply_visitor(mini_xml_node_printer(indent), node);
        }

        tab(indent);
        std::cout << '}' << std::endl;
    }